

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseBitVector.h
# Opt level: O3

BVSparseNode * __thiscall
BVSparse<Memory::ArenaAllocator>::NodeFromIndex
          (BVSparse<Memory::ArenaAllocator> *this,BVIndex i,Type_conflict **prevNextFieldOut,
          bool create)

{
  BVSparse<Memory::ArenaAllocator> *pBVar1;
  BVSparseNode *pBVar2;
  uint uVar3;
  BVSparse<Memory::ArenaAllocator> *pBVar4;
  BVSparse<Memory::ArenaAllocator> *pBVar5;
  
  uVar3 = i & 0xffffffc0;
  pBVar4 = (BVSparse<Memory::ArenaAllocator> *)this->lastUsedNodePrevNextField;
  pBVar1 = (BVSparse<Memory::ArenaAllocator> *)pBVar4->head;
  if (pBVar1 == (BVSparse<Memory::ArenaAllocator> *)0x0) {
LAB_0077b659:
    pBVar4 = this;
    pBVar1 = (BVSparse<Memory::ArenaAllocator> *)this->head;
    if ((BVSparse<Memory::ArenaAllocator> *)this->head == (BVSparse<Memory::ArenaAllocator> *)0x0) {
      pBVar5 = (BVSparse<Memory::ArenaAllocator> *)0x0;
      goto LAB_0077b691;
    }
  }
  else {
    if (*(uint *)&pBVar1->lastFoundIndex == uVar3) {
      *prevNextFieldOut = (Type_conflict *)pBVar4;
      return (BVSparseNode *)pBVar1;
    }
    if (uVar3 < *(uint *)&pBVar1->lastFoundIndex) goto LAB_0077b659;
  }
  do {
    pBVar5 = pBVar1;
    if (uVar3 <= *(uint *)&pBVar5->lastFoundIndex) {
      if (uVar3 == *(uint *)&pBVar5->lastFoundIndex) {
        *prevNextFieldOut = &pBVar4->head;
        this->lastUsedNodePrevNextField = &pBVar4->head;
        return (BVSparseNode *)pBVar5;
      }
      goto LAB_0077b691;
    }
    pBVar4 = pBVar5;
    pBVar1 = (BVSparse<Memory::ArenaAllocator> *)pBVar5->head;
  } while ((BVSparse<Memory::ArenaAllocator> *)pBVar5->head !=
           (BVSparse<Memory::ArenaAllocator> *)0x0);
  pBVar5 = (BVSparse<Memory::ArenaAllocator> *)0x0;
LAB_0077b691:
  if (create) {
    pBVar2 = (BVSparseNode *)new<Memory::ArenaAllocator>(0x18,this->alloc,0x364470);
    pBVar2->next = (Type)pBVar5;
    pBVar2->startIndex = uVar3;
    (pBVar2->data).word = 0;
    pBVar4->head = pBVar2;
    *prevNextFieldOut = &pBVar4->head;
    this->lastUsedNodePrevNextField = &pBVar4->head;
  }
  else {
    pBVar2 = (BVSparseNode *)0x0;
  }
  return pBVar2;
}

Assistant:

BVSparseNode<TAllocator> *
BVSparse<TAllocator>::NodeFromIndex(BVIndex i, Field(BVSparseNode*, TAllocator)** prevNextFieldOut, bool create)
{
    const BVIndex searchIndex = SparseBVUnit::Floor(i);

    Field(BVSparseNode*, TAllocator)* prevNextField = this->lastUsedNodePrevNextField;
    BVSparseNode* curNode = *prevNextField;
    if (curNode != nullptr)
    {
        if (curNode->startIndex == searchIndex)
        {
            *prevNextFieldOut = prevNextField;
            return curNode;
        }

        if (curNode->startIndex > searchIndex)
        {
            prevNextField = &this->head;
            curNode = this->head;
        }
    }
    else
    {
        prevNextField = &this->head;
        curNode = this->head;
    }

    for (; curNode && searchIndex > curNode->startIndex; curNode = curNode->next)
    {
        prevNextField = &curNode->next;
    }

    if(curNode && searchIndex == curNode->startIndex)
    {
        *prevNextFieldOut = prevNextField;
        this->lastUsedNodePrevNextField = prevNextField;
        return curNode;
    }

    if(!create)
    {
        return nullptr;
    }

    BVSparseNode * newNode = Allocate(searchIndex, *prevNextField);
    *prevNextField = newNode;
    *prevNextFieldOut = prevNextField;
    this->lastUsedNodePrevNextField = prevNextField;
    return newNode;
}